

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_info.h
# Opt level: O2

vector<long,_std::allocator<long>_> *
pybind11::detail::c_strides
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,
          vector<long,_std::allocator<long>_> *shape,ssize_t itemsize)

{
  pointer plVar1;
  pointer plVar2;
  size_type __n;
  long lVar3;
  allocator_type local_31;
  ssize_t local_30;
  
  plVar1 = (shape->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  plVar2 = (shape->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  __n = (long)plVar1 - (long)plVar2 >> 3;
  local_30 = itemsize;
  std::vector<long,_std::allocator<long>_>::vector(__return_storage_ptr__,__n,&local_30,&local_31);
  if (plVar1 != plVar2) {
    plVar1 = (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    plVar2 = (shape->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar3 = __n - 1;
    while (lVar3 != 0) {
      plVar1[lVar3 + -1] = plVar2[lVar3] * plVar1[lVar3];
      lVar3 = lVar3 + -1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<ssize_t> c_strides(const std::vector<ssize_t> &shape, ssize_t itemsize) {
    auto ndim = shape.size();
    std::vector<ssize_t> strides(ndim, itemsize);
    if (ndim > 0)
        for (size_t i = ndim - 1; i > 0; --i)
            strides[i - 1] = strides[i] * shape[i];
    return strides;
}